

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardMapper.hpp
# Opt level: O0

uint16_t __thiscall PCCompatible::KeyboardMapper::mapped_key_for_key(KeyboardMapper *this,Key key)

{
  Key key_local;
  KeyboardMapper *this_local;
  
  switch(key) {
  case Escape:
    this_local._6_2_ = 1;
    break;
  case F1:
    this_local._6_2_ = 0x3b;
    break;
  case F2:
    this_local._6_2_ = 0x3c;
    break;
  case F3:
    this_local._6_2_ = 0x3d;
    break;
  case F4:
    this_local._6_2_ = 0x3e;
    break;
  case F5:
    this_local._6_2_ = 0x3f;
    break;
  case F6:
    this_local._6_2_ = 0x40;
    break;
  case F7:
    this_local._6_2_ = 0x41;
    break;
  case F8:
    this_local._6_2_ = 0x42;
    break;
  case F9:
    this_local._6_2_ = 0x43;
    break;
  case F10:
    this_local._6_2_ = 0x44;
    break;
  case F11:
    this_local._6_2_ = 0x57;
    break;
  case F12:
    this_local._6_2_ = 0x58;
    break;
  default:
    this_local._6_2_ = 0xfffe;
    break;
  case ScrollLock:
    this_local._6_2_ = 0x46;
    break;
  case BackTick:
    this_local._6_2_ = 0x29;
    break;
  case k1:
    this_local._6_2_ = 2;
    break;
  case k2:
    this_local._6_2_ = 3;
    break;
  case k3:
    this_local._6_2_ = 4;
    break;
  case k4:
    this_local._6_2_ = 5;
    break;
  case k5:
    this_local._6_2_ = 6;
    break;
  case k6:
    this_local._6_2_ = 7;
    break;
  case k7:
    this_local._6_2_ = 8;
    break;
  case k8:
    this_local._6_2_ = 9;
    break;
  case k9:
    this_local._6_2_ = 10;
    break;
  case k0:
    this_local._6_2_ = 0xb;
    break;
  case Hyphen:
    this_local._6_2_ = 0xc;
    break;
  case Equals:
    this_local._6_2_ = 0xd;
    break;
  case Backspace:
    this_local._6_2_ = 0xe;
    break;
  case Tab:
    this_local._6_2_ = 0xf;
    break;
  case Q:
    this_local._6_2_ = 0x10;
    break;
  case W:
    this_local._6_2_ = 0x11;
    break;
  case E:
    this_local._6_2_ = 0x12;
    break;
  case R:
    this_local._6_2_ = 0x13;
    break;
  case T:
    this_local._6_2_ = 0x14;
    break;
  case Y:
    this_local._6_2_ = 0x15;
    break;
  case U:
    this_local._6_2_ = 0x16;
    break;
  case I:
    this_local._6_2_ = 0x17;
    break;
  case O:
    this_local._6_2_ = 0x18;
    break;
  case P:
    this_local._6_2_ = 0x19;
    break;
  case OpenSquareBracket:
    this_local._6_2_ = 0x1a;
    break;
  case CloseSquareBracket:
    this_local._6_2_ = 0x1b;
    break;
  case Backslash:
    this_local._6_2_ = 0x2b;
    break;
  case CapsLock:
    this_local._6_2_ = 0x3a;
    break;
  case A:
    this_local._6_2_ = 0x1e;
    break;
  case S:
    this_local._6_2_ = 0x1f;
    break;
  case D:
    this_local._6_2_ = 0x20;
    break;
  case F:
    this_local._6_2_ = 0x21;
    break;
  case G:
    this_local._6_2_ = 0x22;
    break;
  case H:
    this_local._6_2_ = 0x23;
    break;
  case J:
    this_local._6_2_ = 0x24;
    break;
  case K:
    this_local._6_2_ = 0x25;
    break;
  case L:
    this_local._6_2_ = 0x26;
    break;
  case Semicolon:
    this_local._6_2_ = 0x27;
    break;
  case Quote:
    this_local._6_2_ = 0x28;
    break;
  case Enter:
    this_local._6_2_ = 0x1c;
    break;
  case LeftShift:
    this_local._6_2_ = 0x2a;
    break;
  case Z:
    this_local._6_2_ = 0x2c;
    break;
  case X:
    this_local._6_2_ = 0x2d;
    break;
  case C:
    this_local._6_2_ = 0x2e;
    break;
  case V:
    this_local._6_2_ = 0x2f;
    break;
  case B:
    this_local._6_2_ = 0x30;
    break;
  case N:
    this_local._6_2_ = 0x31;
    break;
  case M:
    this_local._6_2_ = 0x32;
    break;
  case Comma:
    this_local._6_2_ = 0x33;
    break;
  case FullStop:
    this_local._6_2_ = 0x34;
    break;
  case ForwardSlash:
    this_local._6_2_ = 0x35;
    break;
  case RightShift:
    this_local._6_2_ = 0x36;
    break;
  case LeftControl:
  case RightControl:
    this_local._6_2_ = 0x1d;
    break;
  case LeftOption:
  case RightOption:
    this_local._6_2_ = 0x38;
    break;
  case Space:
    this_local._6_2_ = 0x39;
    break;
  case Left:
  case Keypad4:
    this_local._6_2_ = 0x4b;
    break;
  case Right:
  case Keypad6:
    this_local._6_2_ = 0x4d;
    break;
  case Up:
  case Keypad8:
    this_local._6_2_ = 0x48;
    break;
  case Down:
  case Keypad2:
    this_local._6_2_ = 0x50;
    break;
  case NumLock:
    this_local._6_2_ = 0x45;
    break;
  case KeypadAsterisk:
    this_local._6_2_ = 0x37;
    break;
  case Keypad7:
    this_local._6_2_ = 0x47;
    break;
  case Keypad9:
    this_local._6_2_ = 0x49;
    break;
  case KeypadPlus:
    this_local._6_2_ = 0x4e;
    break;
  case Keypad5:
    this_local._6_2_ = 0x4c;
    break;
  case KeypadMinus:
    this_local._6_2_ = 0x4a;
    break;
  case Keypad1:
    this_local._6_2_ = 0x4f;
    break;
  case Keypad3:
    this_local._6_2_ = 0x51;
    break;
  case Keypad0:
    this_local._6_2_ = 0x52;
    break;
  case KeypadDecimalPoint:
    this_local._6_2_ = 0x53;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t mapped_key_for_key(Inputs::Keyboard::Key key) const override {
			using k = Inputs::Keyboard::Key;
			switch(key) {
				case k::Escape:		return 1;

				case k::k1:			return 2;
				case k::k2:			return 3;
				case k::k3:			return 4;
				case k::k4:			return 5;
				case k::k5:			return 6;
				case k::k6:			return 7;
				case k::k7:			return 8;
				case k::k8:			return 9;
				case k::k9:			return 10;
				case k::k0:			return 11;

				case k::Hyphen:		return 12;
				case k::Equals:		return 13;
				case k::Backspace:	return 14;

				case k::Tab:		return 15;
				case k::Q:			return 16;
				case k::W:			return 17;
				case k::E:			return 18;
				case k::R:			return 19;
				case k::T:			return 20;
				case k::Y:			return 21;
				case k::U:			return 22;
				case k::I:			return 23;
				case k::O:			return 24;
				case k::P:			return 25;

				case k::OpenSquareBracket:	return 26;
				case k::CloseSquareBracket:	return 27;
				case k::Enter:				return 28;

				case k::LeftControl:
				case k::RightControl:		return 29;

				case k::A:			return 30;
				case k::S:			return 31;
				case k::D:			return 32;
				case k::F:			return 33;
				case k::G:			return 34;
				case k::H:			return 35;
				case k::J:			return 36;
				case k::K:			return 37;
				case k::L:			return 38;

				case k::Semicolon:	return 39;
				case k::Quote:		return 40;
				case k::BackTick:	return 41;

				case k::LeftShift:	return 42;
				case k::Backslash:	return 43;

				case k::Z:			return 44;
				case k::X:			return 45;
				case k::C:			return 46;
				case k::V:			return 47;
				case k::B:			return 48;
				case k::N:			return 49;
				case k::M:			return 50;

				case k::Comma:			return 51;
				case k::FullStop:		return 52;
				case k::ForwardSlash:	return 53;
				case k::RightShift:		return 54;

				case k::KeypadAsterisk:	return 55;

				case k::LeftOption:
				case k::RightOption:	return 56;
				case k::Space:			return 57;
				case k::CapsLock:		return 58;

				case k::F1:				return 59;
				case k::F2:				return 60;
				case k::F3:				return 61;
				case k::F4:				return 62;
				case k::F5:				return 63;
				case k::F6:				return 64;
				case k::F7:				return 65;
				case k::F8:				return 66;
				case k::F9:				return 67;
				case k::F10:			return 68;

				case k::NumLock:		return 69;
				case k::ScrollLock:		return 70;

				case k::Keypad7:		return 71;
				case k::Up:
				case k::Keypad8:		return 72;
				case k::Keypad9:		return 73;
				case k::KeypadMinus:	return 74;

				case k::Left:
				case k::Keypad4:		return 75;
				case k::Keypad5:		return 76;
				case k::Right:
				case k::Keypad6:		return 77;
				case k::KeypadPlus:		return 78;

				case k::Keypad1:		return 79;
				case k::Down:
				case k::Keypad2:		return 80;
				case k::Keypad3:		return 81;

				case k::Keypad0:			return 82;
				case k::KeypadDecimalPoint:	return 83;
				/* TODO: SysReq = 84 */

				case k::F11:			return 87;
				case k::F12:			return 88;

				default:	return MachineTypes::MappedKeyboardMachine::KeyNotMapped;
			}
		}